

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O2

bool __thiscall FScriptLoader::ParseInfo(FScriptLoader *this,MapData *map)

{
  char *pcVar1;
  bool bVar2;
  FileReader *pFVar3;
  level_info_t *this_00;
  int lump;
  int iVar4;
  uint uVar5;
  char *dest;
  DFraggleThinker *pDVar6;
  char *pcVar7;
  DFsScript *pDVar8;
  FFsOptions *pFVar9;
  undefined1 uVar10;
  byte bVar11;
  char *pcVar12;
  FString scriptsrc;
  FName local_34;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  scriptsrc.Chars = FString::NullString.Nothing;
  this->IgnoreInfo = false;
  pFVar3 = map->MapLumps[0].Reader;
  if ((pFVar3 == (FileReader *)0x0) || (iVar4 = (int)pFVar3->Length, iVar4 == 0)) {
    lump = FWadCollection::CheckNumForName(&Wads,"FSGLOBAL");
    if (-1 < lump) {
      iVar4 = FWadCollection::LumpLength(&Wads,lump);
      if (iVar4 != 0) {
        dest = (char *)operator_new__((long)(iVar4 + 3));
        FWadCollection::ReadLump(&Wads,lump,dest);
        bVar11 = 1;
        goto LAB_005eb559;
      }
    }
    uVar10 = 0;
  }
  else {
    dest = (char *)operator_new__((long)(iVar4 + 3));
    bVar11 = 0;
    MapData::Read(map,0,dest,-1);
LAB_005eb559:
    pcVar1 = dest + iVar4;
    pcVar1[0] = '\n';
    pcVar1[1] = '\r';
    pcVar1[2] = '\0';
    this->HasScripts = false;
    this->readtype = RT_OTHER;
    this->drownflag = -1;
    pcVar7 = dest;
    for (pcVar12 = dest; pcVar12 < pcVar1 + 2; pcVar12 = pcVar12 + 1) {
      if (*pcVar12 == '\n') {
        *pcVar12 = '\0';
        if (this->IgnoreInfo == false) {
          ParseInfoCmd(this,pcVar7,&scriptsrc);
        }
        pcVar7 = pcVar12 + 1;
        *pcVar12 = '\n';
      }
    }
    if (this->HasScripts == true) {
      pDVar6 = (DFraggleThinker *)DObject::operator_new(0x60);
      DFraggleThinker::DFraggleThinker(pDVar6);
      pcVar7 = copystring(scriptsrc.Chars);
      pDVar6 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&DFraggleThinker::ActiveThinker)
      ;
      pDVar8 = GC::ReadBarrier<DFsScript>((DFsScript **)&pDVar6->LevelScript);
      pDVar8->data = pcVar7;
      uVar5 = this->drownflag;
      if (uVar5 == 0xffffffff) {
        uVar5 = (uint)(bVar11 | level.maptype != MAPTYPE_DOOM);
        this->drownflag = uVar5;
      }
      this_00 = level.info;
      if (uVar5 == 0) {
        level.airsupply = 0;
      }
      FName::FName(&local_34,"fragglescript");
      pFVar9 = level_info_t::GetOptData<FFsOptions>(this_00,&local_34,false);
      if (pFVar9 != (FFsOptions *)0x0) {
        bVar2 = (bool)(pFVar9->super_FOptionalMapinfoData).field_0x14;
        pDVar6 = GC::ReadBarrier<DFraggleThinker>
                           ((DFraggleThinker **)&DFraggleThinker::ActiveThinker);
        pDVar6->nocheckposition = bVar2;
      }
    }
    operator_delete__(dest);
    uVar10 = this->HasScripts;
  }
  FString::~FString(&scriptsrc);
  return (bool)uVar10;
}

Assistant:

bool FScriptLoader::ParseInfo(MapData * map)
{
	char *lump;
	char *rover;
	char *startofline;
	int lumpsize;
	bool fsglobal=false;
	FString scriptsrc;

	// Global initializazion if not done yet.
	static bool done=false;
					
	// Load the script lump
	IgnoreInfo = false;
	lumpsize = map->Size(0);
	if (lumpsize==0)
	{
		// Try a global FS lump
		int lumpnum=Wads.CheckNumForName("FSGLOBAL");
		if (lumpnum<0) return false;
		lumpsize=Wads.LumpLength(lumpnum);
		if (lumpsize==0) return false;
		fsglobal=true;
		lump=new char[lumpsize+3];
		Wads.ReadLump(lumpnum,lump);
	}
	else
	{
		lump=new char[lumpsize+3];
		map->Read(0, lump);
	}
	// Append a new line. The parser likes to crash when the last character is a valid token.
	lump[lumpsize]='\n';
	lump[lumpsize+1]='\r';
	lump[lumpsize+2]=0;
	lumpsize+=2;
	
	rover = startofline = lump;
	HasScripts=false;
	drownflag=-1;

	readtype = RT_OTHER;
	while(rover < lump+lumpsize)
    {
		if(*rover == '\n') // end of line
		{
			*rover = 0;               // make it an end of string (0)
			if (!IgnoreInfo) ParseInfoCmd(startofline, scriptsrc);
			startofline = rover+1; // next line
			*rover = '\n';            // back to end of line
		}
		rover++;
    }
	if (HasScripts) 
	{
		new DFraggleThinker;
		DFraggleThinker::ActiveThinker->LevelScript->data = copystring(scriptsrc.GetChars());

		if (drownflag==-1) drownflag = (level.maptype != MAPTYPE_DOOM || fsglobal);
		if (!drownflag) level.airsupply=0;	// Legacy doesn't to water damage so we need to check if it has to be disabled here.

		FFsOptions *opt = level.info->GetOptData<FFsOptions>("fragglescript", false);
		if (opt != NULL)
		{
			DFraggleThinker::ActiveThinker->nocheckposition = opt->nocheckposition;
		}
	}


	delete[] lump;
	return HasScripts;
}